

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::minimumSize(ToolBarLayout *this)

{
  minimumSize((ToolBarLayout *)&this[-1].orient);
  return;
}

Assistant:

QSize
ToolBarLayout::minimumSize() const
{
	int width = 0;
	int height = 0;

	const QSize arrowSize = left->sizeHint();

	QSize buttonSize;

	if( !buttons.isEmpty() )
		buttonSize = buttons.at( 0 )->sizeHint();
	else
		buttonSize = QSize( FingerGeometry::width(),
			FingerGeometry::height() );

	const QMargins m = contentsMargins();

	if( orient == Qt::Horizontal )
	{
		width = arrowSize.width() * 2 + buttonSize.width() * 2 + m.left() +
			m.right();
		height = qMax( arrowSize.height(), buttonSize.height() ) + m.top() +
			m.bottom();
	}
	else
	{
		height = arrowSize.height() * 2 + buttonSize.height() * 2 + m.top() +
			m.bottom();
		width = qMax( arrowSize.width(), buttonSize.width() ) + m.left() +
			m.right();
	}

	return QSize( width, height );
}